

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ExtensionSet::SerializeMessageSetWithCachedSizes
          (ExtensionSet *this,CodedOutputStream *output)

{
  _Base_ptr p_Var1;
  
  for (p_Var1 = (this->extensions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->extensions_)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    Extension::SerializeMessageSetItemWithCachedSizes
              ((Extension *)&p_Var1[1]._M_parent,p_Var1[1]._M_color,output);
  }
  return;
}

Assistant:

void ExtensionSet::SerializeMessageSetWithCachedSizes(
    io::CodedOutputStream* output) const {
  map<int, Extension>::const_iterator iter;
  for (iter = extensions_.begin(); iter != extensions_.end(); ++iter) {
    iter->second.SerializeMessageSetItemWithCachedSizes(iter->first, output);
  }
}